

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::ScannersMixin::Print(ScannersMixin *this,DebugWriter *w,char16 *litbuf)

{
  int i;
  long lVar1;
  
  DebugWriter::Print(w,L"literals: {");
  for (lVar1 = 0; lVar1 < this->numLiterals; lVar1 = lVar1 + 1) {
    if (lVar1 != 0) {
      DebugWriter::Print(w,L", ");
    }
    ScannerInfo::Print(this->infos[lVar1].ptr,w,litbuf);
  }
  DebugWriter::Print(w,L"}");
  return;
}

Assistant:

void ScannersMixin::Print(DebugWriter* w, const char16* litbuf) const
    {
        w->Print(_u("literals: {"));
        for (int i = 0; i < numLiterals; i++)
        {
            if (i > 0)
            {
                w->Print(_u(", "));
            }
            infos[i]->Print(w, litbuf);
        }
        w->Print(_u("}"));
    }